

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::coap::Message::GetOption
          (Error *__return_storage_ptr__,Message *this,string *aValue,OptionType aNumber)

{
  OptionValue *this_00;
  char *begin;
  char *pcVar1;
  string *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  OptionType aNumber_local;
  undefined1 local_98 [32];
  type *local_78;
  code *local_70;
  size_t local_68;
  undefined8 local_60;
  format_string_checker<char> *local_58;
  code *local_50;
  undefined1 local_40 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  aNumber_local = aNumber;
  this_00 = GetOption(this,aNumber);
  if (this_00 == (OptionValue *)0x0) {
    local_78 = (type *)CONCAT44(local_78._4_4_,0xf);
    local_70 = (code *)0x1eac50;
    local_68 = 0x18;
    local_60 = 0x100000000;
    local_50 = ::fmt::v10::detail::
               parse_format_specs<ot::commissioner::coap::OptionType,fmt::v10::detail::compile_parse_context<char>>
    ;
    pcVar1 = "CoAP option {} not found";
    local_58 = (format_string_checker<char> *)&local_78;
    while (begin = pcVar1, begin != "") {
      pcVar1 = begin + 1;
      if (*begin == '}') {
        if ((pcVar1 == "") || (*pcVar1 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar1 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar1 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,ot::commissioner::coap::OptionType>&>
                           (begin,"",(format_string_checker<char> *)&local_78);
      }
    }
    local_78 = (type *)&aNumber_local;
    local_70 = ::fmt::v10::detail::value<fmt::v10::basic_format_context<fmt::v10::appender,char>>::
               format_custom_arg<ot::commissioner::coap::OptionType,fmt::v10::formatter<ot::commissioner::coap::OptionType,char,void>>
    ;
    fmt.size_ = 0xf;
    fmt.data_ = (char *)0x18;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_78;
    ::fmt::v10::vformat_abi_cxx11_((string *)local_98,(v10 *)"CoAP option {} not found",fmt,args);
    local_40._0_4_ = kNotFound;
    std::__cxx11::string::string((string *)(local_40 + 8),(string *)local_98);
    Error::operator=(__return_storage_ptr__,(Error *)local_40);
    std::__cxx11::string::~string((string *)(local_40 + 8));
    this_01 = (string *)local_98;
  }
  else {
    OptionValue::GetStringValue_abi_cxx11_((string *)&local_78,this_00);
    this_01 = (string *)&local_78;
    std::__cxx11::string::operator=((string *)aValue,this_01);
  }
  std::__cxx11::string::~string(this_01);
  return __return_storage_ptr__;
}

Assistant:

Error Message::GetOption(std::string &aValue, OptionType aNumber) const
{
    Error error;
    auto  option = GetOption(aNumber);

    VerifyOrExit(option != nullptr, error = ERROR_NOT_FOUND("CoAP option {} not found", aNumber));

    aValue = option->GetStringValue();

exit:
    return error;
}